

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Generators<LargeNumbers> * __thiscall
Catch::Generators::makeGenerators<LargeNumbers,LargeNumbers>
          (Generators<LargeNumbers> *__return_storage_ptr__,Generators *this,LargeNumbers *val,
          LargeNumbers *moreGenerators)

{
  GeneratorWrapper<LargeNumbers> local_20;
  
  local_20.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
  .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_20.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
   .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl =
       &PTR__GeneratorUntypedBase_001c2bd8;
  *(undefined4 *)
   ((long)local_20.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
          .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl
   + 8) = *(undefined4 *)this;
  Generators<LargeNumbers>::
  Generators<Catch::Generators::GeneratorWrapper<LargeNumbers>,LargeNumbers>
            (__return_storage_ptr__,&local_20,val);
  if (local_20.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
      .super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_20.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<LargeNumbers>,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_std::default_delete<Catch::Generators::IGenerator<LargeNumbers>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }